

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::operator==(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *this,GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *rhs)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  Token *pTVar5;
  Token *pTVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  if ((rhs->parseErrorCode_ == kPointerParseErrorNone &&
       this->parseErrorCode_ == kPointerParseErrorNone) &&
     (uVar4 = this->tokenCount_, uVar4 == rhs->tokenCount_)) {
    bVar10 = uVar4 == 0;
    if (!bVar10) {
      pTVar5 = this->tokens_;
      pTVar6 = rhs->tokens_;
      if (pTVar5->index == pTVar6->index) {
        uVar9 = 1;
        lVar8 = 0;
        do {
          uVar3 = *(uint *)((long)&pTVar5->length + lVar8);
          if (uVar3 != *(uint *)((long)&pTVar6->length + lVar8)) {
            return bVar10;
          }
          if (((ulong)uVar3 != 0) &&
             (iVar7 = bcmp(*(void **)((long)&pTVar5->name + lVar8),
                           *(void **)((long)&pTVar6->name + lVar8),(ulong)uVar3), iVar7 != 0)) {
            return bVar10;
          }
          bVar10 = uVar4 <= uVar9;
          if (uVar9 == uVar4) {
            return bVar10;
          }
          piVar1 = (int *)((long)&pTVar5[1].index + lVar8);
          uVar9 = uVar9 + 1;
          piVar2 = (int *)((long)&pTVar6[1].index + lVar8);
          lVar8 = lVar8 + 0x10;
        } while (*piVar1 == *piVar2);
      }
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool operator==(const GenericPointer& rhs) const {
        if (!IsValid() || !rhs.IsValid() || tokenCount_ != rhs.tokenCount_)
            return false;

        for (size_t i = 0; i < tokenCount_; i++) {
            if (tokens_[i].index != rhs.tokens_[i].index ||
                tokens_[i].length != rhs.tokens_[i].length || 
                (tokens_[i].length != 0 && std::memcmp(tokens_[i].name, rhs.tokens_[i].name, sizeof(Ch)* tokens_[i].length) != 0))
            {
                return false;
            }
        }

        return true;
    }